

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdom.cpp
# Opt level: O0

void __thiscall
QDomEntityPrivate::QDomEntityPrivate(QDomEntityPrivate *this,QDomEntityPrivate *n,bool deep)

{
  undefined1 in_DL;
  QDomNodePrivate *in_RSI;
  undefined8 *in_RDI;
  undefined7 in_stack_ffffffffffffffe8;
  
  QDomNodePrivate::QDomNodePrivate
            (in_RSI,(QDomNodePrivate *)
                    (CONCAT17(in_DL,in_stack_ffffffffffffffe8) & 0x1ffffffffffffff),
             SUB81((ulong)in_RDI >> 0x38,0));
  *in_RDI = &PTR__QDomEntityPrivate_001463b0;
  QString::QString((QString *)0x119496);
  QString::QString((QString *)0x1194a7);
  QString::QString((QString *)0x1194b8);
  QString::operator=((QString *)(in_RDI + 0x15),(QString *)(in_RSI + 1));
  QString::operator=((QString *)(in_RDI + 0x18),(QString *)&in_RSI[1].next);
  QString::operator=((QString *)(in_RDI + 0x1b),(QString *)&in_RSI[1].last);
  return;
}

Assistant:

QDomEntityPrivate::QDomEntityPrivate(QDomEntityPrivate* n, bool deep)
    : QDomNodePrivate(n, deep)
{
    m_sys = n->m_sys;
    m_pub = n->m_pub;
    m_notationName = n->m_notationName;
}